

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O2

void __thiscall jrtplib::RTPRawPacket::~RTPRawPacket(RTPRawPacket *this)

{
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPRawPacket_0014f1a0;
  DeleteData(this);
  return;
}

Assistant:

inline RTPRawPacket::~RTPRawPacket()
{
	DeleteData();
}